

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall fasttext::BinaryLogisticLoss::computeOutput(BinaryLogisticLoss *this,State *state)

{
  pointer pfVar1;
  uint uVar2;
  ulong uVar3;
  real rVar4;
  
  Vector::mul(&state->output,
              (((this->super_Loss).wo_)->
              super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
              &state->hidden);
  pfVar1 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (uint)((ulong)((long)(state->output).data_.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pfVar1) >> 2);
  for (uVar3 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar3; uVar3 = uVar3 + 1) {
    rVar4 = Loss::sigmoid(&this->super_Loss,pfVar1[uVar3]);
    pfVar1[uVar3] = rVar4;
  }
  return;
}

Assistant:

void BinaryLogisticLoss::computeOutput(Model::State& state) const {
  Vector& output = state.output;
  output.mul(*wo_, state.hidden);
  int32_t osz = output.size();
  for (int32_t i = 0; i < osz; i++) {
    output[i] = sigmoid(output[i]);
  }
}